

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Token __thiscall slang::parsing::Preprocessor::handleDirectives(Preprocessor *this,Token token)

{
  BumpAllocator *pBVar1;
  Info *pIVar2;
  uint uVar3;
  int iVar4;
  SyntaxKind SVar5;
  size_type __rlen;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  SourceLocation SVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  char *__s1;
  EVP_PKEY_CTX *src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  EVP_PKEY_CTX *src_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  SourceRange range;
  Trivia TVar9;
  string_view sVar10;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar11;
  Token TVar12;
  Token directive;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  SmallVector<slang::parsing::Token,_2UL> tokens;
  SmallVector<slang::parsing::Trivia,_8UL> trivia;
  Token local_140;
  undefined1 local_130 [16];
  undefined1 local_120 [13];
  TriviaKind local_113;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  SmallVectorBase<slang::parsing::Token> local_d8 [3];
  Token *local_58;
  Info *local_50;
  undefined8 local_48;
  Trivia local_40;
  
  uVar7 = token._0_8_;
  local_f8._8_8_ = local_d8;
  local_e8 = 0;
  local_e0 = 8;
  local_58 = &this->lastConsumed;
  local_140 = token;
  do {
    TVar12 = local_140;
    uVar3 = (uint)uVar7 & 0xffff;
    if (uVar3 < 0x15a) {
      if (uVar3 != 0x157) {
        if ((uVar7 & 0xffff) == 0) {
          sVar10 = Token::rawText(&local_140);
          __s1 = sVar10._M_str;
          if (sVar10._M_len == 2) {
            iVar4 = bcmp(__s1,"`\\",2);
            if (iVar4 == 0) {
LAB_00191826:
              SVar8 = Token::location(&local_140);
              Diagnostics::add(this->diagnostics,(DiagCode)0x60002,
                               (SourceLocation)
                               ((long)SVar8 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                               (ulong)(SVar8._0_4_ & 0xfffffff)));
            }
          }
          else if (sVar10._M_len == 1) {
            if (*__s1 == '\\') goto LAB_00191826;
            iVar4 = bcmp(__s1,"`",1);
            if (iVar4 == 0) {
              SVar8 = Token::location(&local_140);
              Diagnostics::add(this->diagnostics,(DiagCode)0xa0002,SVar8);
            }
          }
          sVar11 = Token::trivia(&local_140);
          SmallVectorBase<slang::parsing::Trivia>::
          append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),sVar11._M_ptr,
                     sVar11._M_ptr + sVar11._M_extent._M_extent_value._M_extent_value);
          pBVar1 = this->alloc;
          iVar4 = SmallVectorBase<slang::parsing::Trivia>::copy
                            ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                             (EVP_PKEY_CTX *)pBVar1,src_01);
          sVar11._M_ptr._4_4_ = extraout_var_01;
          sVar11._M_ptr._0_4_ = iVar4;
          sVar11._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
          TVar12 = Token::withTrivia(&local_140,pBVar1,sVar11);
          goto LAB_001918a7;
        }
LAB_001917c4:
        sVar11 = Token::trivia(&local_140);
        SmallVectorBase<slang::parsing::Trivia>::
        append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                  ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),sVar11._M_ptr,
                   sVar11._M_ptr + sVar11._M_extent._M_extent_value._M_extent_value);
        pBVar1 = this->alloc;
        iVar4 = SmallVectorBase<slang::parsing::Trivia>::copy
                          ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                           (EVP_PKEY_CTX *)pBVar1,src_00);
        trivia_00._M_ptr._4_4_ = extraout_var_00;
        trivia_00._M_ptr._0_4_ = iVar4;
        trivia_00._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
        TVar12 = Token::withTrivia(&local_140,pBVar1,trivia_00);
LAB_001918a7:
        if ((SmallVectorBase<slang::parsing::Token> *)local_f8._8_8_ != local_d8) {
          operator_delete((void *)local_f8._8_8_);
        }
        return TVar12;
      }
      local_48._0_2_ = (this->lastConsumed).kind;
      local_48._2_1_ = (this->lastConsumed).field_0x2;
      local_48._3_1_ = (this->lastConsumed).numFlags;
      local_48._4_4_ = (this->lastConsumed).rawLen;
      local_50 = (this->lastConsumed).info;
      local_58->kind = local_140.kind;
      local_58->field_0x2 = local_140._2_1_;
      local_58->numFlags = (NumericTokenFlags)local_140.numFlags.raw;
      local_58->rawLen = local_140.rawLen;
      local_58->info = local_140.info;
      local_140 = TVar12;
      SVar5 = Token::directiveKind(&local_140);
      TVar12 = local_140;
      if ((int)SVar5 < 0xe7) {
        if ((int)SVar5 < 0xa7) {
          if (SVar5 - DefaultDecayTimeDirective < 0x13) {
            lVar6 = (long)&switchD_001910c1::switchdataD_0046295c +
                    (long)(int)(&switchD_001910c1::switchdataD_0046295c)
                               [SVar5 - DefaultDecayTimeDirective];
            switch(SVar5) {
            case DefaultDecayTimeDirective:
              TVar9 = handleDefaultDecayTimeDirective(this,local_140);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            default:
switchD_001910c1_caseD_7f:
              if ((SmallVectorBase<slang::parsing::Token> *)local_f8._8_8_ !=
                  (SmallVectorBase<slang::parsing::Token> *)local_130) {
                operator_delete((void *)local_f8._8_8_);
              }
              _Unwind_Resume(lVar6);
            case DefaultNetTypeDirective:
              TVar9 = handleDefaultNetTypeDirective(this,local_140);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            case DefaultTriregStrengthDirective:
              TVar9 = handleDefaultTriregStrengthDirective(this,local_140);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            case DefineDirective:
              TVar9 = handleDefineDirective(this,local_140);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            case DelayModeDistributedDirective:
            case DelayModePathDirective:
            case DelayModeUnitDirective:
            case DelayModeZeroDirective:
switchD_001910c1_caseD_8d:
              TVar9 = createSimpleDirective(this,local_140);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
          }
          else if (SVar5 == BeginKeywordsDirective) {
            TVar9 = handleBeginKeywordsDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
          else {
            this->cellDefine = true;
            TVar9 = createSimpleDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
        }
        else if (SVar5 - ElseDirective < 0xf) {
          lVar6 = (long)&switchD_00191187::switchdataD_004629a8 +
                  (long)(int)(&switchD_00191187::switchdataD_004629a8)[SVar5 - ElseDirective];
          switch(SVar5) {
          case ElseDirective:
            TVar9 = handleElseDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          default:
            goto switchD_001910c1_caseD_7f;
          case EndCellDefineDirective:
            this->cellDefine = false;
            TVar9 = createSimpleDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          case EndIfDirective:
            TVar9 = handleEndIfDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          case EndKeywordsDirective:
            TVar9 = handleEndKeywordsDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          case EndProtectDirective:
          case EndProtectedDirective:
            goto switchD_001910c1_caseD_8d;
          }
        }
        else {
          TVar9 = handleElsIfDirective(this,local_140);
          local_130._0_8_ = TVar9.field_0._0_8_;
          local_130._8_6_ = TVar9._8_6_;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130);
        }
      }
      else {
        pIVar2 = local_140.info;
        if ((int)SVar5 < 0x181) {
          if ((int)SVar5 < 0x111) {
            if (SVar5 == IfDefDirective) {
              TVar9 = handleIfDefDirective(this,local_140,false);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
            else if (SVar5 == IfNDefDirective) {
              TVar9 = handleIfDefDirective(this,local_140,true);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
            else {
              TVar9 = handleIncludeDirective(this,local_140);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
          }
          else if ((int)SVar5 < 0x148) {
            if (SVar5 == LineDirective) {
              TVar9 = handleLineDirective(this,local_140);
              local_130._0_8_ = TVar9.field_0._0_8_;
              local_130._8_6_ = TVar9._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
            else {
              handleMacroUsage((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)local_130,
                               this,local_140);
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              if (local_113 != Unknown) {
                SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                          ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                           (Trivia *)local_120);
              }
            }
          }
          else if (SVar5 == NoUnconnectedDriveDirective) {
            local_f8._0_2_ = local_140.kind;
            local_f8[2] = local_140._2_1_;
            local_f8[3] = local_140.numFlags.raw;
            local_f8._4_4_ = local_140.rawLen;
            local_140 = TVar12;
            checkOutsideDesignElement(this,TVar12);
            this->unconnectedDrive = Unknown;
            directive.info = pIVar2;
            directive.kind = local_f8._0_2_;
            directive._2_1_ = local_f8[2];
            directive.numFlags.raw = local_f8[3];
            directive.rawLen = local_f8._4_4_;
            TVar9 = createSimpleDirective(this,directive);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
          else {
            handlePragmaDirective
                      ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)local_130,this,
                       local_140);
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            if (local_113 != Unknown) {
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_120);
            }
          }
        }
        else if ((int)SVar5 < 0x1cf) {
          if (SVar5 == ProtectDirective) goto switchD_001910c1_caseD_8d;
          if (SVar5 == ProtectedDirective) {
            handleProtectedDirective
                      ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)local_130,this,
                       local_140);
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            if (local_113 != Unknown) {
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_120);
            }
          }
          else {
            TVar9 = handleResetAllDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
        }
        else if ((int)SVar5 < 0x1f8) {
          if (SVar5 == TimeScaleDirective) {
            TVar9 = handleTimeScaleDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
          else {
            TVar9 = handleUnconnectedDriveDirective(this,local_140);
            local_130._0_8_ = TVar9.field_0._0_8_;
            local_130._8_6_ = TVar9._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
        }
        else if (SVar5 == UndefDirective) {
          TVar9 = handleUndefDirective(this,local_140);
          local_130._0_8_ = TVar9.field_0._0_8_;
          local_130._8_6_ = TVar9._8_6_;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130);
        }
        else {
          local_f8._0_2_ = local_140.kind;
          local_f8[2] = local_140._2_1_;
          local_f8[3] = local_140.numFlags.raw;
          local_f8._4_4_ = local_140.rawLen;
          local_140 = TVar12;
          undefineAll(this);
          TVar12.info = pIVar2;
          TVar12.kind = local_f8._0_2_;
          TVar12._2_1_ = local_f8[2];
          TVar12.numFlags.raw = local_f8[3];
          TVar12.rawLen = local_f8._4_4_;
          TVar9 = createSimpleDirective(this,TVar12);
          local_130._0_8_ = TVar9.field_0._0_8_;
          local_130._8_6_ = TVar9._8_6_;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130);
        }
      }
      (this->lastConsumed).kind = (undefined2)local_48;
      (this->lastConsumed).field_0x2 = local_48._2_1_;
      (this->lastConsumed).numFlags = (NumericTokenFlags)local_48._3_1_;
      (this->lastConsumed).rawLen = local_48._4_4_;
      (this->lastConsumed).info = local_50;
    }
    else {
      if ((3 < uVar3 - 0x15a) && (uVar3 != 0x15f)) goto LAB_001917c4;
      local_130._8_8_ = 0;
      local_120._0_8_ = (char *)0x2;
      local_130._0_8_ = (pointer)(local_120 + 8);
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                ((SmallVectorBase<slang::parsing::Token> *)local_130,&local_140);
      iVar4 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)local_130,
                         (EVP_PKEY_CTX *)this->alloc,src);
      tokens_00._M_ptr._4_4_ = extraout_var;
      tokens_00._M_ptr._0_4_ = iVar4;
      tokens_00._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      Trivia::Trivia(&local_40,SkippedTokens,tokens_00);
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),&local_40);
      range = Token::range(&local_140);
      Diagnostics::add(this->diagnostics,(DiagCode)0x100004,range);
      if ((pointer)local_130._0_8_ != (pointer)(local_120 + 8)) {
        operator_delete((void *)local_130._0_8_);
      }
    }
    local_140 = nextRaw(this);
    uVar7 = local_140._0_8_;
  } while( true );
}

Assistant:

Token Preprocessor::handleDirectives(Token token) {
    // burn through any preprocessor directives we find and convert them to trivia
    SmallVector<Trivia, 8> trivia;
    while (true) {
        switch (token.kind) {
            case TokenKind::MacroQuote:
            case TokenKind::MacroTripleQuote:
            case TokenKind::MacroEscapedQuote:
            case TokenKind::MacroPaste:
            case TokenKind::LineContinuation: {
                SmallVector<Token> tokens;
                tokens.push_back(token);
                trivia.push_back(Trivia(TriviaKind::SkippedTokens, tokens.copy(alloc)));
                addDiag(diag::MacroOpsOutsideDefinition, token.range());
                break;
            }
            case TokenKind::Unknown: {
                // This is an error in the lexer. See if we should issue any more
                // specific diagnostics here (that were deferred until we know we're
                // not inside a macro) and then return the token.
                auto raw = token.rawText();
                if (raw == "\\" || raw == "`\\")
                    addDiag(diag::EscapedWhitespace, token.location() + 1);
                else if (raw == "`")
                    addDiag(diag::MisplacedDirectiveChar, token.location());

                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
            }
            case TokenKind::Directive: {
                auto savedLast = std::exchange(lastConsumed, token);
                switch (token.directiveKind()) {
                    case SyntaxKind::IncludeDirective:
                        trivia.push_back(handleIncludeDirective(token));
                        break;
                    case SyntaxKind::ResetAllDirective:
                        trivia.push_back(handleResetAllDirective(token));
                        break;
                    case SyntaxKind::DefineDirective:
                        trivia.push_back(handleDefineDirective(token));
                        break;
                    case SyntaxKind::MacroUsage: {
                        auto [directive, extra] = handleMacroUsage(token);
                        trivia.push_back(directive);
                        if (extra)
                            trivia.push_back(extra);
                        break;
                    }
                    case SyntaxKind::IfDefDirective:
                        trivia.push_back(handleIfDefDirective(token, false));
                        break;
                    case SyntaxKind::IfNDefDirective:
                        trivia.push_back(handleIfDefDirective(token, true));
                        break;
                    case SyntaxKind::ElsIfDirective:
                        trivia.push_back(handleElsIfDirective(token));
                        break;
                    case SyntaxKind::ElseDirective:
                        trivia.push_back(handleElseDirective(token));
                        break;
                    case SyntaxKind::EndIfDirective:
                        trivia.push_back(handleEndIfDirective(token));
                        break;
                    case SyntaxKind::TimeScaleDirective:
                        trivia.push_back(handleTimeScaleDirective(token));
                        break;
                    case SyntaxKind::DefaultNetTypeDirective:
                        trivia.push_back(handleDefaultNetTypeDirective(token));
                        break;
                    case SyntaxKind::LineDirective:
                        trivia.push_back(handleLineDirective(token));
                        break;
                    case SyntaxKind::UndefDirective:
                        trivia.push_back(handleUndefDirective(token));
                        break;
                    case SyntaxKind::UndefineAllDirective:
                        trivia.push_back(handleUndefineAllDirective(token));
                        break;
                    case SyntaxKind::BeginKeywordsDirective:
                        trivia.push_back(handleBeginKeywordsDirective(token));
                        break;
                    case SyntaxKind::EndKeywordsDirective:
                        trivia.push_back(handleEndKeywordsDirective(token));
                        break;
                    case SyntaxKind::PragmaDirective: {
                        auto [directive, skipped] = handlePragmaDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::UnconnectedDriveDirective:
                        trivia.push_back(handleUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::NoUnconnectedDriveDirective:
                        trivia.push_back(handleNoUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::CellDefineDirective:
                        trivia.push_back(handleCellDefineDirective(token));
                        break;
                    case SyntaxKind::EndCellDefineDirective:
                        trivia.push_back(handleEndCellDefineDirective(token));
                        break;
                    case SyntaxKind::DefaultDecayTimeDirective:
                        trivia.push_back(handleDefaultDecayTimeDirective(token));
                        break;
                    case SyntaxKind::DefaultTriregStrengthDirective:
                        trivia.push_back(handleDefaultTriregStrengthDirective(token));
                        break;
                    case SyntaxKind::ProtectedDirective: {
                        auto [directive, skipped] = handleProtectedDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::DelayModeDistributedDirective:
                    case SyntaxKind::DelayModePathDirective:
                    case SyntaxKind::DelayModeUnitDirective:
                    case SyntaxKind::DelayModeZeroDirective:
                    case SyntaxKind::ProtectDirective:
                    case SyntaxKind::EndProtectDirective:
                    case SyntaxKind::EndProtectedDirective:
                        // we don't do anything with these directives currently
                        trivia.push_back(createSimpleDirective(token));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
                lastConsumed = savedLast;
                break;
            }
            default:
                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
        }

        token = nextRaw();
    }
}